

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BOOL DisableThreadLibraryCalls(HMODULE hLibModule)

{
  int iVar1;
  BOOL BVar2;
  MODSTRUCT *module;
  BOOL ret;
  HMODULE hLibModule_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  LockModuleList();
  iVar1 = Volatile::operator_cast_to_int((Volatile *)&terminator);
  if (iVar1 == 0) {
    BVar2 = LOADValidateModule((MODSTRUCT *)hLibModule);
    if (BVar2 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else {
      *(undefined4 *)((long)hLibModule + 0x24) = 0;
    }
  }
  UnlockModuleList();
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return 1;
  }
  abort();
}

Assistant:

BOOL
PALAPI
DisableThreadLibraryCalls(
    IN HMODULE hLibModule)
{
    BOOL ret = FALSE;
    MODSTRUCT *module;
    PERF_ENTRY(DisableThreadLibraryCalls);
    ENTRY("DisableThreadLibraryCalls(hLibModule=%p)\n", hLibModule);

    LockModuleList();

    if (terminator)
    {
        /* PAL shutdown in progress - ignore DisableThreadLibraryCalls */
        ret = TRUE;
        goto done;
    }

    module = (MODSTRUCT *) hLibModule;

    if (!LOADValidateModule(module))
    {
        // DisableThreadLibraryCalls() does nothing when given
        // an invalid module handle. This matches the Windows
        // behavior, though it is counter to MSDN.
        WARN("Invalid module handle %p\n", hLibModule);
        ret = TRUE;
        goto done;
    }

    module->threadLibCalls = FALSE;
    ret = TRUE;

done:
    UnlockModuleList();
    LOGEXIT("DisableThreadLibraryCalls returns BOOL %d\n", ret);
    PERF_EXIT(DisableThreadLibraryCalls);
    return ret;
}